

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

void __thiscall S2BooleanOperation::Impl::~Impl(Impl *this)

{
  pointer ppVar1;
  
  std::
  _Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
  ::~_Vector_base(&(this->tmp_crossings_).
                   super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                 );
  std::
  _Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
  ::~_Vector_base(&(this->index_crossings_).
                   super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                 );
  ppVar1 = (this->input_crossings_).
           super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1);
  }
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            (&(this->input_dimensions_).
              super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  std::unique_ptr<S2Builder,_std::default_delete<S2Builder>_>::~unique_ptr(&this->builder_);
  return;
}

Assistant:

explicit Impl(S2BooleanOperation* op)
      : op_(op), index_crossings_first_region_id_(-1) {
  }